

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall
soul::HEARTGenerator::initialiseArrayOrStructElements
          (HEARTGenerator *this,Expression *target,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> list,Context *errorLocation)

{
  FunctionBuilder *this_00;
  char cVar1;
  Expression *source;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pool_ref<soul::AST::Expression> *ppVar4;
  Constant *pCVar5;
  undefined4 extraout_var_01;
  Structure *pSVar6;
  Member *pMVar7;
  ArrayElement *destVar;
  pool_ref<soul::AST::Expression> *ppVar8;
  ulong i;
  pool_ptr<soul::AST::Constant> constElement;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> local_70;
  HEARTGenerator *local_60;
  pool_ptr<soul::AST::Constant> local_58;
  string local_50;
  
  ppVar4 = list.e;
  ppVar8 = list.s;
  local_70.s = ppVar8;
  local_70.e = ppVar4;
  iVar3 = (*(target->super_Object)._vptr_Object[2])(target);
  bVar2 = Type::isFixedSizeAggregate((Type *)CONCAT44(extraout_var,iVar3));
  if (!bVar2) {
    throwInternalCompilerError
              ("targetType.isFixedSizeAggregate()","initialiseArrayOrStructElements",0x3f9);
  }
  SanityCheckPass::throwErrorIfWrongNumberOfElements
            (errorLocation,(Type *)CONCAT44(extraout_var,iVar3),(long)ppVar4 - (long)ppVar8 >> 3);
  iVar3 = (*(target->super_Object)._vptr_Object[2])(target);
  cVar1 = *(char *)CONCAT44(extraout_var_00,iVar3);
  this_00 = &this->builder;
  local_60 = this;
  BlockBuilder::addZeroAssignment(&this_00->super_BlockBuilder,target);
  i = 0;
  do {
    if ((ulong)((long)ppVar4 - (long)ppVar8 >> 3) <= i) {
      return;
    }
    ppVar4 = ArrayView<soul::pool_ref<soul::AST::Expression>_>::operator[](&local_70,i);
    source = ppVar4->object;
    (*(source->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_58,source);
    if (local_58.object == (Constant *)0x0) {
LAB_0026acb7:
      if (cVar1 == '\x06') {
        iVar3 = (*(target->super_Object)._vptr_Object[2])(target);
        pSVar6 = Type::getStructRef((Type *)CONCAT44(extraout_var_01,iVar3));
        pMVar7 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                           (&pSVar6->members,i);
        std::__cxx11::string::string((string *)&local_50,(string *)&pMVar7->name);
        destVar = (ArrayElement *)
                  BlockBuilder::createStructElement(&this_00->super_BlockBuilder,target,&local_50);
      }
      else {
        destVar = BlockBuilder::createFixedArrayElement(&this_00->super_BlockBuilder,target,i);
      }
      createAssignment(local_60,&destVar->super_Expression,source);
      if (cVar1 == '\x06') {
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    else {
      pCVar5 = pool_ptr<soul::AST::Constant>::operator->(&local_58);
      bVar2 = soul::Value::isZero(&pCVar5->value);
      if (!bVar2) goto LAB_0026acb7;
    }
    i = i + 1;
    ppVar4 = local_70.e;
    ppVar8 = local_70.s;
  } while( true );
}

Assistant:

void initialiseArrayOrStructElements (heart::Expression& target, ArrayView<pool_ref<AST::Expression>> list,
                                          const AST::Context& errorLocation)
    {
        const auto& targetType = target.getType();
        SOUL_ASSERT (targetType.isFixedSizeAggregate());
        SanityCheckPass::throwErrorIfWrongNumberOfElements (errorLocation, targetType, list.size());
        bool isStruct = target.getType().isStruct();

        builder.addZeroAssignment (target);

        for (size_t i = 0; i < list.size(); ++i)
        {
            auto& sourceValue = list[i].get();

            if (auto constElement = sourceValue.getAsConstant())
                if (constElement->value.isZero()) // no need to assign to elements which are zero
                    continue;

            createAssignment (isStruct ? (heart::Expression&) builder.createStructElement (target, target.getType().getStructRef().getMemberName (i))
                                       : (heart::Expression&) builder.createFixedArrayElement (target, i),
                              sourceValue);
        }
    }